

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-strip.cc
# Opt level: O3

void __thiscall
BinaryReaderStrip::BinaryReaderStrip
          (BinaryReaderStrip *this,
          set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          *sections_to_keep,
          set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          *sections_to_remove,Errors *errors)

{
  MemoryStream *this_00;
  undefined8 in_RAX;
  undefined4 local_38;
  undefined4 local_34;
  
  local_34 = (undefined4)((ulong)in_RAX >> 0x20);
  (this->super_BinaryReaderNop).super_BinaryReaderDelegate.state = (State *)0x0;
  (this->super_BinaryReaderNop).super_BinaryReaderDelegate._vptr_BinaryReaderDelegate =
       (_func_int **)&PTR__BinaryReaderStrip_00134c80;
  this_00 = &this->stream_;
  wabt::MemoryStream::MemoryStream(this_00,(Stream *)0x0);
  this->errors_ = errors;
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::_Rb_tree(&(this->sections_to_keep_)._M_t,&sections_to_keep->_M_t);
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::_Rb_tree(&(this->sections_to_remove_)._M_t,&sections_to_remove->_M_t);
  this->section_start_ = 0;
  _local_38 = CONCAT44(local_34,0x6d736100);
  wabt::Stream::WriteData(&this_00->super_Stream,&local_38,4,"WASM_BINARY_MAGIC",No);
  _local_38 = CONCAT44(1,local_38);
  wabt::Stream::WriteData(&this_00->super_Stream,&local_34,4,"WASM_BINARY_VERSION",No);
  return;
}

Assistant:

explicit BinaryReaderStrip(std::set<std::string_view> sections_to_keep,
                             std::set<std::string_view> sections_to_remove,
                             Errors* errors)
      : errors_(errors),
        sections_to_keep_(sections_to_keep),
        sections_to_remove_(sections_to_remove),
        section_start_(0) {
    stream_.WriteU32(WABT_BINARY_MAGIC, "WASM_BINARY_MAGIC");
    stream_.WriteU32(WABT_BINARY_VERSION, "WASM_BINARY_VERSION");
  }